

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O1

bool __thiscall CASC_FILE_TREE::RebuildTreeMaps(CASC_FILE_TREE *this)

{
  size_t MaxItems;
  PCASC_MAP p_Var1;
  bool bVar2;
  ulong uVar3;
  LPBYTE pBVar4;
  DWORD DataId;
  int local_2c;
  
  MaxItems = (this->FileTable).m_ItemCountMax;
  local_2c = 0;
  if (this->pNameMap != (PCASC_MAP)0x0) {
    Map_Free(this->pNameMap);
  }
  this->pNameMap = (PCASC_MAP)0x0;
  if (this->pIdMap != (PCASC_MAP)0x0) {
    Map_Free(this->pIdMap);
  }
  this->pIdMap = (PCASC_MAP)0x0;
  p_Var1 = Map_Create(MaxItems,8,0x10);
  this->pNameMap = p_Var1;
  if (p_Var1 == (PCASC_MAP)0x0) {
LAB_0010ef10:
    bVar2 = false;
  }
  else {
    if (this->DataIdOffset != 0) {
      p_Var1 = Map_Create(MaxItems,4,this->DataIdOffset);
      this->pIdMap = p_Var1;
      if (p_Var1 == (PCASC_MAP)0x0) goto LAB_0010ef10;
    }
    bVar2 = true;
    if ((this->FileTable).m_ItemCount != 0) {
      uVar3 = 0;
      do {
        pBVar4 = (this->FileTable).m_pItemArray;
        if (pBVar4 != (LPBYTE)0x0) {
          pBVar4 = pBVar4 + (this->FileTable).m_ItemSize * uVar3;
          if ((this->pNameMap != (PCASC_MAP)0x0) && (*(long *)(pBVar4 + 0x10) != 0)) {
            Map_InsertObject(this->pNameMap,pBVar4,pBVar4 + 0x10);
          }
          if (this->DataIdOffset != 0) {
            if (*(int *)(pBVar4 + this->DataIdOffset) != -1) {
              local_2c = *(int *)(pBVar4 + this->DataIdOffset);
            }
            if ((this->pIdMap != (PCASC_MAP)0x0) && (local_2c != -1)) {
              Map_InsertObject(this->pIdMap,pBVar4,&local_2c);
            }
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->FileTable).m_ItemCount);
    }
  }
  return bVar2;
}

Assistant:

bool CASC_FILE_TREE::RebuildTreeMaps()
{
    PCASC_FILE_NODE pFileNode;
    size_t nMaxItems = FileTable.ItemCountMax();
    DWORD DataId = 0;

    // Free the map of FullName -> CASC_FILE_NODE
    if(pNameMap != NULL)
        Map_Free(pNameMap);
    pNameMap = NULL;

    // Free the map of DataId -> CASC_FILE_NODE
    if(pIdMap != NULL)
        Map_Free(pIdMap);
    pIdMap = NULL;

    // Create the name map
    pNameMap = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_FILE_NODE, NameHash));
    if(pNameMap == NULL)
        return false;

    // Create the DataId map
    if(DataIdOffset != 0)
    {
        pIdMap = Map_Create(nMaxItems, sizeof(DWORD), DataIdOffset);
        if(pIdMap == NULL)
            return false;
    }

    // Parse all items and insert them to the map
    for(size_t i = 0; i < FileTable.ItemCount(); i++)
    {
        pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(i);
        if(pFileNode != NULL)
        {
            // Insert the file by name
            if(pNameMap != NULL && pFileNode->NameHash != 0)
                Map_InsertObject(pNameMap, pFileNode, &pFileNode->NameHash);

            // Insert the file by data ID, if supported
            if(DataIdOffset != 0)
            {
                GetExtras(pFileNode, &DataId, NULL, NULL);
                if(pIdMap != NULL && DataId != CASC_INVALID_ID)
                {
                    Map_InsertObject(pIdMap, pFileNode, &DataId);
                }
            }
        }
    }

    return true;
}